

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsConstantOrGroupBy(Parse *pParse,Expr *p,ExprList *pGroupBy)

{
  undefined1 local_50 [8];
  Walker w;
  ExprList *pGroupBy_local;
  Expr *p_local;
  Parse *pParse_local;
  
  w.xSelectCallback2._4_1_ = 1;
  w.pParse = (Parse *)exprNodeIsConstantOrGroupBy;
  w.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
  local_50 = (undefined1  [8])pParse;
  w._32_8_ = pGroupBy;
  w.u.pGroupBy = pGroupBy;
  sqlite3WalkExpr((Walker *)local_50,p);
  return (int)w.xSelectCallback2._4_1_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsConstantOrGroupBy(Parse *pParse, Expr *p, ExprList *pGroupBy){
  Walker w;
  w.eCode = 1;
  w.xExprCallback = exprNodeIsConstantOrGroupBy;
  w.xSelectCallback = 0;
  w.u.pGroupBy = pGroupBy;
  w.pParse = pParse;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}